

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfCards.cpp
# Opt level: O3

void __thiscall DeckOfCards::currentState(DeckOfCards *this)

{
  pointer pCVar1;
  pointer pcVar2;
  ostream *poVar3;
  pointer pCVar4;
  Cards i;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  vector<int,_std::allocator<int>_> local_50;
  iterator local_38;
  
  pCVar4 = (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar4 != pCVar1) {
    do {
      local_a0._0_4_ = pCVar4->id;
      pcVar2 = (pCVar4->name)._M_dataplus._M_p;
      local_98._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar2,pcVar2 + (pCVar4->name)._M_string_length);
      pcVar2 = (pCVar4->description)._M_dataplus._M_p;
      local_78._M_p = (pointer)&local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,pcVar2 + (pCVar4->description)._M_string_length);
      local_58._0_4_ = pCVar4->type;
      local_58._4_4_ = pCVar4->energyCost;
      std::vector<int,_std::allocator<int>_>::vector(&local_50,&pCVar4->effect);
      local_38._M_current = (pCVar4->it)._M_current;
      poVar3 = operator<<((ostream *)&std::cout,(Cards *)local_a0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 != pCVar1);
  }
  return;
}

Assistant:

void DeckOfCards::currentState() {
    for (Cards i : *deck) {
        cout << i << endl;
    }
}